

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O3

void __thiscall
OSTEI_HRR_Algorithm_Base::Create
          (OSTEI_HRR_Algorithm_Base *this,QAM *am,RRStepType brasteptype,RRStepType ketsteptype)

{
  pointer pcVar1;
  initializer_list<QAM> __l;
  allocator_type local_8a;
  less<QAM> local_89;
  undefined1 local_88 [16];
  _Alloc_hider local_78;
  char local_68 [24];
  _Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_> local_50;
  
  local_88._0_4_ = (am->qam)._M_elems[0];
  local_88._4_4_ = (am->qam)._M_elems[1];
  local_88._8_4_ = (am->qam)._M_elems[2];
  local_88._12_4_ = (am->qam)._M_elems[3];
  pcVar1 = (am->tag)._M_dataplus._M_p;
  local_78._M_p = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + (am->tag)._M_string_length);
  __l._M_len = 1;
  __l._M_array = (iterator)local_88;
  std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::set
            ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)&local_50,__l,&local_89,&local_8a);
  Create(this,(set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)&local_50,brasteptype,ketsteptype);
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::~_Rb_tree
            (&local_50);
  if (local_78._M_p != local_68) {
    operator_delete(local_78._M_p);
  }
  return;
}

Assistant:

void OSTEI_HRR_Algorithm_Base::Create(QAM am,
                                      RRStepType brasteptype,
                                      RRStepType ketsteptype)
{
    Create(std::set<QAM>{am}, brasteptype, ketsteptype);
}